

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void __thiscall duckdb_parquet::AesGcmCtrV1::printTo(AesGcmCtrV1 *this,ostream *out)

{
  _AesGcmCtrV1__isset _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_00;
  string local_80;
  string local_60;
  string local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"AesGcmCtrV1(",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"aad_prefix=",0xb);
  _Var1 = this->__isset;
  if (((byte)_Var1 & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<std::__cxx11::string>(&local_40,(thrift *)&this->aad_prefix,t);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)out,local_40._M_dataplus._M_p,local_40._M_string_length);
  }
  if ((((byte)_Var1 & 1) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2)) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"aad_file_unique=",0x10);
  _Var1 = this->__isset;
  if (((byte)_Var1 & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<std::__cxx11::string>
              (&local_60,(thrift *)&this->aad_file_unique,t_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)out,local_60._M_dataplus._M_p,local_60._M_string_length);
  }
  if ((((byte)_Var1 & 2) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2)) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"supply_aad_prefix=",0x12);
  _Var1 = this->__isset;
  if (((byte)_Var1 & 4) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<bool>(&local_80,&this->supply_aad_prefix);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)out,local_80._M_dataplus._M_p,local_80._M_string_length);
  }
  if ((((byte)_Var1 & 4) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2)) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,")",1);
  return;
}

Assistant:

void AesGcmCtrV1::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "AesGcmCtrV1(";
  out << "aad_prefix="; (__isset.aad_prefix ? (out << to_string(aad_prefix)) : (out << "<null>"));
  out << ", " << "aad_file_unique="; (__isset.aad_file_unique ? (out << to_string(aad_file_unique)) : (out << "<null>"));
  out << ", " << "supply_aad_prefix="; (__isset.supply_aad_prefix ? (out << to_string(supply_aad_prefix)) : (out << "<null>"));
  out << ")";
}